

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLDocument::NewElement(XMLDocument *this,char *name)

{
  XMLElement *this_00;
  XMLElement *ele;
  char *name_local;
  XMLDocument *this_local;
  
  this_00 = (XMLElement *)MemPoolT<104>::Alloc(&this->_elementPool);
  XMLElement::XMLElement(this_00,this);
  (this_00->super_XMLNode)._memPool = &(this->_elementPool).super_MemPool;
  XMLElement::SetName(this_00,name,false);
  return this_00;
}

Assistant:

XMLElement* XMLDocument::NewElement( const char* name )
{
    TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
    XMLElement* ele = new (_elementPool.Alloc()) XMLElement( this );
    ele->_memPool = &_elementPool;
    ele->SetName( name );
    return ele;
}